

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_api.c
# Opt level: O0

MPP_RET h264d_init(void *decoder,ParserCfg *init)

{
  void *pvVar1;
  H264_DecCtx_t *p_Dec;
  MPP_RET ret;
  ParserCfg *init_local;
  void *decoder_local;
  
  if (decoder == (void *)0x0) {
    if ((h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0x146);
    }
LAB_001b5f29:
    decoder_local._4_4_ = MPP_OK;
  }
  else {
    memset(decoder,0,0xd8);
    mpp_env_get_u32("h264d_debug",&h264d_debug,1);
    *(MppBufSlots *)((long)decoder + 0x68) = init->frame_slots;
    *(MppBufSlots *)((long)decoder + 0x70) = init->packet_slots;
    *(MppDecCfgSet **)((long)decoder + 0x78) = init->cfg;
    mpp_frame_init((MppFrame *)((long)decoder + 0x88));
    pvVar1 = mpp_osal_calloc("h264d_init",0x490);
    *(void **)((long)decoder + 0x38) = pvVar1;
    pvVar1 = mpp_osal_calloc("h264d_init",0x21a0);
    *(void **)((long)decoder + 0x40) = pvVar1;
    pvVar1 = mpp_osal_calloc("h264d_init",0xd30);
    *(void **)((long)decoder + 0x48) = pvVar1;
    if (((*(long *)((long)decoder + 0x38) == 0) || (*(long *)((long)decoder + 0x40) == 0)) ||
       (*(long *)((long)decoder + 0x48) == 0)) {
      p_Dec._4_4_ = MPP_ERR_MALLOC;
      if ((h264d_debug & 1) != 0) {
        _mpp_log_l(4,"h264d_api","malloc buffer error(%d).\n",(char *)0x0,0x154);
      }
    }
    else {
      **(undefined8 **)((long)decoder + 0x38) = decoder;
      *(undefined8 *)(*(long *)((long)decoder + 0x38) + 8) = *(undefined8 *)((long)decoder + 0x40);
      *(undefined8 *)(*(long *)((long)decoder + 0x38) + 0x10) =
           *(undefined8 *)((long)decoder + 0x48);
      *(void **)(*(long *)((long)decoder + 0x40) + 0x1c28) = decoder;
      *(undefined8 *)(*(long *)((long)decoder + 0x40) + 0x1c20) =
           *(undefined8 *)((long)decoder + 0x38);
      *(undefined8 *)(*(long *)((long)decoder + 0x40) + 0x1c30) =
           *(undefined8 *)((long)decoder + 0x48);
      *(void **)(*(long *)((long)decoder + 0x48) + 0xa18) = decoder;
      *(undefined8 *)(*(long *)((long)decoder + 0x48) + 0xa20) =
           *(undefined8 *)((long)decoder + 0x38);
      *(undefined8 *)(*(long *)((long)decoder + 0x48) + 0xa28) =
           *(undefined8 *)((long)decoder + 0x40);
      *(MppDecHwCap **)((long)decoder + 0x80) = init->hw_info;
      p_Dec._4_4_ = init_input_ctx(*(H264dInputCtx_t **)((long)decoder + 0x38),init);
      if (p_Dec._4_4_ < MPP_OK) {
        if ((h264d_debug & 4) != 0) {
          _mpp_log_l(4,"h264d_api","Function error(%d).\n",(char *)0x0,0x161);
        }
      }
      else {
        p_Dec._4_4_ = init_cur_ctx(*(H264dCurCtx_t **)((long)decoder + 0x40));
        if (p_Dec._4_4_ < MPP_OK) {
          if ((h264d_debug & 4) != 0) {
            _mpp_log_l(4,"h264d_api","Function error(%d).\n",(char *)0x0,0x162);
          }
        }
        else {
          p_Dec._4_4_ = init_vid_ctx(*(H264dVideoCtx_t **)((long)decoder + 0x48));
          if (p_Dec._4_4_ < MPP_OK) {
            if ((h264d_debug & 4) != 0) {
              _mpp_log_l(4,"h264d_api","Function error(%d).\n",(char *)0x0,0x163);
            }
          }
          else {
            p_Dec._4_4_ = init_dec_ctx((H264_DecCtx_t *)decoder);
            if (MPP_NOK < p_Dec._4_4_) {
              *(undefined4 *)((long)decoder + 0xb4) =
                   *(undefined4 *)(*(long *)((long)decoder + 0x78) + 0x1c);
              mpp_env_get_u32("force_fast_play_mode",
                              (RK_U32 *)(*(long *)((long)decoder + 0x48) + 0xd0c),
                              *(RK_U32 *)(*(long *)((long)decoder + 0x78) + 0x38));
              if ((h264d_debug & 8) != 0) {
                _mpp_log_l(4,"h264d_api","fast play mode: %d",(char *)0x0,
                           (ulong)*(uint *)(*(long *)((long)decoder + 0x48) + 0xd0c));
              }
              *(undefined4 *)(*(long *)((long)decoder + 0x48) + 0xd10) = 0;
              mpp_slots_set_prop(*(MppBufSlots *)((long)decoder + 0x68),SLOTS_WIDTH_ALIGN,
                                 rkv_mblock_width_align);
              goto LAB_001b5f29;
            }
            if ((h264d_debug & 4) != 0) {
              _mpp_log_l(4,"h264d_api","Function error(%d).\n",(char *)0x0,0x164);
            }
          }
        }
      }
    }
    h264d_deinit(decoder);
    decoder_local._4_4_ = p_Dec._4_4_;
  }
  return decoder_local._4_4_;
}

Assistant:

MPP_RET h264d_init(void *decoder, ParserCfg *init)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_DecCtx_t *p_Dec = (H264_DecCtx_t *)decoder;
    INP_CHECK(ret, !p_Dec);
    memset(p_Dec, 0, sizeof(H264_DecCtx_t));

    mpp_env_get_u32("h264d_debug", &h264d_debug, H264D_DBG_ERROR);

    //!< get init frame_slots and packet_slots
    p_Dec->frame_slots  = init->frame_slots;
    p_Dec->packet_slots = init->packet_slots;
    p_Dec->cfg = init->cfg;
    mpp_frame_init(&p_Dec->curframe);
    //!< malloc decoder buffer
    p_Dec->p_Inp = mpp_calloc(H264dInputCtx_t, 1);
    p_Dec->p_Cur = mpp_calloc(H264dCurCtx_t, 1);
    p_Dec->p_Vid = mpp_calloc(H264dVideoCtx_t, 1);
    MEM_CHECK(ret, p_Dec->p_Inp && p_Dec->p_Cur && p_Dec->p_Vid);
    p_Dec->p_Inp->p_Dec = p_Dec;
    p_Dec->p_Inp->p_Cur = p_Dec->p_Cur;
    p_Dec->p_Inp->p_Vid = p_Dec->p_Vid;

    p_Dec->p_Cur->p_Dec = p_Dec;
    p_Dec->p_Cur->p_Inp = p_Dec->p_Inp;
    p_Dec->p_Cur->p_Vid = p_Dec->p_Vid;

    p_Dec->p_Vid->p_Dec = p_Dec;
    p_Dec->p_Vid->p_Inp = p_Dec->p_Inp;
    p_Dec->p_Vid->p_Cur = p_Dec->p_Cur;
    p_Dec->hw_info      = init->hw_info;
    FUN_CHECK(ret = init_input_ctx(p_Dec->p_Inp, init));
    FUN_CHECK(ret = init_cur_ctx(p_Dec->p_Cur));
    FUN_CHECK(ret = init_vid_ctx(p_Dec->p_Vid));
    FUN_CHECK(ret = init_dec_ctx(p_Dec));
    p_Dec->immediate_out = p_Dec->cfg->base.fast_out;
    mpp_env_get_u32("force_fast_play_mode", &p_Dec->p_Vid->dpb_fast_out,
                    p_Dec->cfg->base.enable_fast_play);
    H264D_LOG("fast play mode: %d", p_Dec->p_Vid->dpb_fast_out);
    p_Dec->p_Vid->dpb_first_fast_played = 0;
    mpp_slots_set_prop(p_Dec->frame_slots, SLOTS_WIDTH_ALIGN, rkv_mblock_width_align);
__RETURN:
    return ret = MPP_OK;
__FAILED:
    h264d_deinit(decoder);

    return ret;
}